

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicCounter.h
# Opt level: O3

void __thiscall aeron::concurrent::AtomicCounter::~AtomicCounter(AtomicCounter *this)

{
  int iVar1;
  element_type *peVar2;
  long lVar3;
  int *piVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar5;
  int local_1c;
  
  this->_vptr_AtomicCounter = (_func_int **)&PTR__AtomicCounter_00163b28;
  peVar2 = (this->m_countersManager).
           super___shared_ptr<aeron::concurrent::CountersManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar2 != (element_type *)0x0) {
    iVar1 = this->m_counterId;
    local_1c = iVar1;
    if (*(long *)(peVar2 + 0x98) == 0) {
      std::__throw_bad_function_call();
    }
    lVar5 = (**(code **)(peVar2 + 0xa0))(peVar2 + 0x88);
    lVar3 = *(long *)(peVar2 + 8);
    *(long *)(lVar3 + 8 + (long)iVar1 * 0x200) = lVar5 + *(long *)(peVar2 + 0xa8);
    *(undefined4 *)(lVar3 + (long)iVar1 * 0x200) = 0xffffffff;
    piVar4 = *(int **)(peVar2 + 0x68);
    if (piVar4 == (int *)(*(long *)(peVar2 + 0x78) + -4)) {
      std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                ((deque<int,std::allocator<int>> *)(peVar2 + 0x38),&local_1c);
    }
    else {
      *piVar4 = iVar1;
      *(int **)(peVar2 + 0x68) = piVar4 + 1;
    }
  }
  this_00 = (this->m_countersManager).
            super___shared_ptr<aeron::concurrent::CountersManager,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

virtual ~AtomicCounter()
    {
        if (nullptr != m_countersManager)
        {
            m_countersManager->free(m_counterId);
        }
    }